

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O2

void __thiscall
Js::ScriptContext::FieldAccessStatsEntry::FieldAccessStatsEntry
          (FieldAccessStatsEntry *this,RecyclerWeakReference<Js::FunctionBody> *functionBodyWeakRef,
          Recycler *recycler)

{
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>::WriteBarrierSet
            (&this->functionBodyWeakRef,functionBodyWeakRef);
  SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>::SListBase
            (&(this->stats).super_SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>);
  (this->stats).allocator = recycler;
  return;
}

Assistant:

FieldAccessStatsEntry(RecyclerWeakReference<FunctionBody>* functionBodyWeakRef, Recycler* recycler)
                : functionBodyWeakRef(functionBodyWeakRef), stats(recycler) {}